

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O2

ssize_t __thiscall
ovf::detail::write::file_handle::write(file_handle *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  int i;
  ulong uVar3;
  long lVar4;
  
  sVar2 = std::__basic_file<char>::is_open();
  if ((char)sVar2 != '\0') {
    lVar4 = 0;
    for (uVar3 = 0; lVar1 = *(long *)CONCAT44(in_register_00000034,__fd),
        uVar3 < (ulong)(((long *)CONCAT44(in_register_00000034,__fd))[1] - lVar1 >> 5);
        uVar3 = uVar3 + 1) {
      std::operator<<((ostream *)this,(string *)(lVar1 + lVar4));
      lVar4 = lVar4 + 0x20;
    }
    sVar2 = std::ofstream::close();
    return sVar2;
  }
  return sVar2;
}

Assistant:

inline void file_handle::write(const std::vector<std::string> & text)
    {
        if( myfile.is_open() )
        {
            // Log(Log_Level::Debug, Log_Sender::All, "Started writing " + name);
            for (int i = 0; i < text.size(); ++i)
                myfile << text[i];

            myfile.close();
            // Log(Log_Level::Debug, Log_Sender::All, "Finished writing " + name);
        }
        else
        {
            // Log(Log_Level::Error, Log_Sender::All, "Could not open " + name + " to write to file");
        }
    }